

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleControlBytes
          (HashSetResizeHelper *this,ctrl_t *new_ctrl,size_t new_capacity)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  
  if (0x10 < new_capacity) {
    __assert_fail("is_single_group(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x15b,
                  "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleControlBytes(ctrl_t *__restrict, size_t) const"
                 );
  }
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar2 < 8) {
    if (this[0x19] != (HashSetResizeHelper)0x1) {
      uVar3 = 0x7fL << ((char)(uVar2 >> 1) * '\b' & 0x3fU) ^
              *(ulong *)(*(long *)this + 1 + (uVar2 >> 1));
      *(undefined8 *)new_ctrl = uVar3;
      pcVar1 = new_ctrl + uVar2 + 1;
      pcVar1[0] = kEmpty;
      pcVar1[1] = kEmpty;
      pcVar1[2] = kEmpty;
      pcVar1[3] = kEmpty;
      pcVar1[4] = kEmpty;
      pcVar1[5] = kEmpty;
      pcVar1[6] = kEmpty;
      pcVar1[7] = kEmpty;
      pcVar1[8] = kEmpty;
      pcVar1[9] = kEmpty;
      pcVar1[10] = kEmpty;
      pcVar1[0xb] = kEmpty;
      pcVar1[0xc] = kEmpty;
      pcVar1[0xd] = kEmpty;
      pcVar1[0xe] = kEmpty;
      pcVar1[0xf] = kEmpty;
      pcVar1 = new_ctrl + new_capacity + 8;
      pcVar1[0] = kEmpty;
      pcVar1[1] = kEmpty;
      pcVar1[2] = kEmpty;
      pcVar1[3] = kEmpty;
      pcVar1[4] = kEmpty;
      pcVar1[5] = kEmpty;
      pcVar1[6] = kEmpty;
      pcVar1[7] = kEmpty;
      *(undefined8 *)(new_ctrl + new_capacity + 1) = uVar3;
      pcVar1 = new_ctrl + uVar2 + 2 + new_capacity;
      pcVar1[0] = kEmpty;
      pcVar1[1] = kEmpty;
      pcVar1[2] = kEmpty;
      pcVar1[3] = kEmpty;
      new_ctrl[new_capacity] = kSentinel;
      return;
    }
    __assert_fail("!was_soo_",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7be,"ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
  }
  __assert_fail("old_capacity_ < kHalfWidth",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x15e,
                "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleControlBytes(ctrl_t *__restrict, size_t) const"
               );
}

Assistant:

void HashSetResizeHelper::GrowIntoSingleGroupShuffleControlBytes(
    ctrl_t* __restrict new_ctrl, size_t new_capacity) const {
  assert(is_single_group(new_capacity));
  constexpr size_t kHalfWidth = Group::kWidth / 2;
  constexpr size_t kQuarterWidth = Group::kWidth / 4;
  assert(old_capacity_ < kHalfWidth);
  static_assert(sizeof(uint64_t) >= kHalfWidth,
                "Group size is too large. The ctrl bytes for half a group must "
                "fit into a uint64_t for this implementation.");
  static_assert(sizeof(uint64_t) <= Group::kWidth,
                "Group size is too small. The ctrl bytes for a group must "
                "cover a uint64_t for this implementation.");

  const size_t half_old_capacity = old_capacity_ / 2;

  // NOTE: operations are done with compile time known size = kHalfWidth.
  // Compiler optimizes that into single ASM operation.

  // Load the bytes from half_old_capacity + 1. This contains the last half of
  // old_ctrl bytes, followed by the sentinel byte, and then the first half of
  // the cloned bytes. This effectively shuffles the control bytes.
  uint64_t copied_bytes = 0;
  copied_bytes =
      absl::little_endian::Load64(old_ctrl() + half_old_capacity + 1);

  // We change the sentinel byte to kEmpty before storing to both the start of
  // the new_ctrl, and past the end of the new_ctrl later for the new cloned
  // bytes. Note that this is faster than setting the sentinel byte to kEmpty
  // after the copy directly in new_ctrl because we are limited on store
  // bandwidth.
  constexpr uint64_t kEmptyXorSentinel =
      static_cast<uint8_t>(ctrl_t::kEmpty) ^
      static_cast<uint8_t>(ctrl_t::kSentinel);
  const uint64_t mask_convert_old_sentinel_to_empty =
      kEmptyXorSentinel << (half_old_capacity * 8);
  copied_bytes ^= mask_convert_old_sentinel_to_empty;

  // Copy second half of bytes to the beginning. This correctly sets the bytes
  // [0, old_capacity]. We potentially copy more bytes in order to have compile
  // time known size. Mirrored bytes from the old_ctrl() will also be copied. In
  // case of old_capacity_ == 3, we will copy 1st element twice.
  // Examples:
  // (old capacity = 1)
  // old_ctrl = 0S0EEEEEEE...
  // new_ctrl = E0EEEEEE??...
  //
  // (old capacity = 3)
  // old_ctrl = 012S012EEEEE...
  // new_ctrl = 12E012EE????...
  //
  // (old capacity = 7)
  // old_ctrl = 0123456S0123456EE...
  // new_ctrl = 456E0123?????????...
  absl::little_endian::Store64(new_ctrl, copied_bytes);

  // Set the space [old_capacity + 1, new_capacity] to empty as these bytes will
  // not be written again. This is safe because
  // NumControlBytes = new_capacity + kWidth and new_capacity >=
  // old_capacity+1.
  // Examples:
  // (old_capacity = 3, new_capacity = 15)
  // new_ctrl  = 12E012EE?????????????...??
  // *new_ctrl = 12E0EEEEEEEEEEEEEEEE?...??
  // position        /          S
  //
  // (old_capacity = 7, new_capacity = 15)
  // new_ctrl  = 456E0123?????????????????...??
  // *new_ctrl = 456E0123EEEEEEEEEEEEEEEE?...??
  // position            /      S
  std::memset(new_ctrl + old_capacity_ + 1, static_cast<int8_t>(ctrl_t::kEmpty),
              Group::kWidth);

  // Set the last kHalfWidth bytes to empty, to ensure the bytes all the way to
  // the end are initialized.
  // Examples:
  // new_ctrl  = 12E0EEEEEEEEEEEEEEEE?...???????
  // *new_ctrl = 12E0EEEEEEEEEEEEEEEE???EEEEEEEE
  // position                   S       /
  //
  // new_ctrl  = 456E0123EEEEEEEEEEEEEEEE???????
  // *new_ctrl = 456E0123EEEEEEEEEEEEEEEEEEEEEEE
  // position                   S       /
  std::memset(new_ctrl + NumControlBytes(new_capacity) - kHalfWidth,
              static_cast<int8_t>(ctrl_t::kEmpty), kHalfWidth);

  // Copy the first bytes to the end (starting at new_capacity +1) to set the
  // cloned bytes. Note that we use the already copied bytes from old_ctrl here
  // rather than copying from new_ctrl to avoid a Read-after-Write hazard, since
  // new_ctrl was just written to. The first old_capacity-1 bytes are set
  // correctly. Then there may be up to old_capacity bytes that need to be
  // overwritten, and any remaining bytes will be correctly set to empty. This
  // sets [new_capacity + 1, new_capacity +1 + old_capacity] correctly.
  // Examples:
  // new_ctrl  = 12E0EEEEEEEEEEEEEEEE?...???????
  // *new_ctrl = 12E0EEEEEEEEEEEE12E012EEEEEEEEE
  // position                   S/
  //
  // new_ctrl  = 456E0123EEEEEEEE?...???EEEEEEEE
  // *new_ctrl = 456E0123EEEEEEEE456E0123EEEEEEE
  // position                   S/
  absl::little_endian::Store64(new_ctrl + new_capacity + 1, copied_bytes);

  // Set The remaining bytes at the end past the cloned bytes to empty. The
  // incorrectly set bytes are [new_capacity + old_capacity + 2,
  // min(new_capacity + 1 + kHalfWidth, new_capacity + old_capacity + 2 +
  // half_old_capacity)]. Taking the difference, we need to set min(kHalfWidth -
  // (old_capacity + 1), half_old_capacity)]. Since old_capacity < kHalfWidth,
  // half_old_capacity < kQuarterWidth, so we set kQuarterWidth beginning at
  // new_capacity + old_capacity + 2 to kEmpty.
  // Examples:
  // new_ctrl  = 12E0EEEEEEEEEEEE12E012EEEEEEEEE
  // *new_ctrl = 12E0EEEEEEEEEEEE12E0EEEEEEEEEEE
  // position                   S    /
  //
  // new_ctrl  = 456E0123EEEEEEEE456E0123EEEEEEE
  // *new_ctrl = 456E0123EEEEEEEE456E0123EEEEEEE (no change)
  // position                   S        /
  std::memset(new_ctrl + new_capacity + old_capacity_ + 2,
              static_cast<int8_t>(ctrl_t::kEmpty), kQuarterWidth);

  // Finally, we set the new sentinel byte.
  new_ctrl[new_capacity] = ctrl_t::kSentinel;
}